

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O2

void pbrt::detail::
     stringPrintfRecursive<bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&>
               (string *s,char *fmt,bool *v,bool *args,bool *args_1,bool *args_2,bool *args_3,
               bool *args_4,bool *args_5,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_7,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_8,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_9,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_10,
               optional<pbrt::Bounds2<float>_> *args_11,optional<pbrt::Bounds2<int>_> *args_12)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  bool *pbVar5;
  char *s_00;
  int line;
  char cVar6;
  enable_if_t<_std::is_class<typename_std::decay_t<const_bool_&>_>::value,_std::string> local_78;
  char *fmt_local;
  string nextFmt;
  
  pbVar5 = args;
  fmt_local = fmt;
  copyToFormatString(&nextFmt,&fmt_local,s);
  cVar6 = (char)&nextFmt;
  lVar1 = std::__cxx11::string::find(cVar6,0x2a);
  lVar2 = std::__cxx11::string::find(cVar6,0x73);
  lVar3 = std::__cxx11::string::find(cVar6,100);
  if (lVar1 != -1) {
    s_00 = "MEH";
    line = 0xbe;
LAB_00341a7e:
    LogFatal(Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/print.h"
             ,line,s_00);
  }
  if (lVar2 == -1) {
    if (lVar3 == -1) {
      if (nextFmt._M_string_length == 0) {
        s_00 = "Excess values passed to Printf.";
        line = 0x10d;
        goto LAB_00341a7e;
      }
      formatOne<bool_const&>(&local_78,(detail *)nextFmt._M_dataplus._M_p,v,pbVar5);
      std::__cxx11::string::append((string *)s);
    }
    else {
      uVar4 = std::__cxx11::string::find((char)&nextFmt,100);
      pbVar5 = (bool *)0x3d4e38;
      std::__cxx11::string::replace((ulong)&nextFmt,uVar4,(char *)0x1);
      formatOne<bool_const&>(&local_78,(detail *)nextFmt._M_dataplus._M_p,v,pbVar5);
      std::__cxx11::string::append((string *)s);
    }
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    std::__cxx11::string::append((char *)s);
  }
  stringPrintfRecursive<bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&>
            (s,fmt_local,args,args_1,args_2,args_3,args_4,args_5,args_6,args_7,args_8,args_9,args_10
             ,args_11,args_12);
  std::__cxx11::string::~string((string *)&nextFmt);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}